

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

char * GetPrevDirectoryPath(char *dirPath)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int local_18;
  int i;
  int pathLen;
  char *dirPath_local;
  
  memset(GetPrevDirectoryPath::prevDirPath,0,0x1000);
  sVar3 = strlen(dirPath);
  iVar2 = (int)sVar3;
  local_18 = iVar2;
  if (iVar2 < 4) {
    strcpy(GetPrevDirectoryPath::prevDirPath,dirPath);
  }
  do {
    iVar1 = local_18;
    local_18 = iVar1 + -1;
    if (local_18 < 0 || iVar2 < 4) goto LAB_0012fe02;
  } while ((dirPath[local_18] != '\\') && (dirPath[local_18] != '/'));
  if (((local_18 == 2) && (dirPath[1] == ':')) || (local_18 == 0)) {
    local_18 = iVar1;
  }
  strncpy(GetPrevDirectoryPath::prevDirPath,dirPath,(long)local_18);
LAB_0012fe02:
  return GetPrevDirectoryPath::prevDirPath;
}

Assistant:

const char *GetPrevDirectoryPath(const char *dirPath)
{
    static char prevDirPath[MAX_FILEPATH_LENGTH];
    memset(prevDirPath, 0, MAX_FILEPATH_LENGTH);
    int pathLen = (int)strlen(dirPath);

    if (pathLen <= 3) strcpy(prevDirPath, dirPath);

    for (int i = (pathLen - 1); (i >= 0) && (pathLen > 3); i--)
    {
        if ((dirPath[i] == '\\') || (dirPath[i] == '/'))
        {
            // Check for root: "C:\" or "/"
            if (((i == 2) && (dirPath[1] ==':')) || (i == 0)) i++;

            strncpy(prevDirPath, dirPath, i);
            break;
        }
    }

    return prevDirPath;
}